

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_distance_of_landscapes_on_grid.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer pdVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  reference ppcVar5;
  pointer pdVar6;
  reference pvVar7;
  reference first;
  reference second;
  reference pvVar8;
  double dVar9;
  size_type local_320;
  size_t j_1;
  size_t i_3;
  ofstream out;
  size_type local_110;
  size_t j;
  size_t i_2;
  value_type_conflict local_f8;
  undefined1 local_f0 [8];
  vector<double,_std::allocator<double>_> v;
  size_t i_1;
  undefined1 local_c8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  distance;
  Persistence_landscape_on_grid l;
  size_t file_no;
  vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
  landscaspes;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  double p;
  int pp;
  char **argv_local;
  int argc_local;
  
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
                          );
  poVar3 = std::operator<<(poVar3,"be created beforehand).\n");
  poVar3 = std::operator<<(poVar3,
                           "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
                          );
  poVar3 = std::operator<<(poVar3,"maps. For L^infty distance choose p = -1. \n");
  std::operator<<(poVar3,
                  "The remaining parameters of this program are names of files with persistence landscapes on grid.\n"
                 );
  if (argc < 3) {
    std::operator<<((ostream *)&std::clog,
                    "Wrong number of parameters, the program will now terminate \n");
    argv_local._4_4_ = 1;
  }
  else {
    iVar2 = atoi(argv[1]);
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)std::numeric_limits<double>::max();
    if (iVar2 != -1) {
      filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(double)iVar2;
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
    for (local_44 = 2; local_44 < argc; local_44 = local_44 + 1) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40,argv + local_44);
    }
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::vector((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
              *)&file_no);
    sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::reserve((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
               *)&file_no,sVar4);
    l.number_of_functions_for_projections_to_reals = 0;
    while( true ) {
      sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
      if (l.number_of_functions_for_projections_to_reals == sVar4) break;
      Gudhi::Persistence_representations::Persistence_landscape_on_grid::
      Persistence_landscape_on_grid
                ((Persistence_landscape_on_grid *)
                 &distance.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40,
                           l.number_of_functions_for_projections_to_reals);
      Gudhi::Persistence_representations::Persistence_landscape_on_grid::load_landscape_from_file
                ((Persistence_landscape_on_grid *)
                 &distance.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppcVar5);
      std::
      vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
      ::push_back((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                   *)&file_no,
                  (value_type *)
                  &distance.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Gudhi::Persistence_representations::Persistence_landscape_on_grid::
      ~Persistence_landscape_on_grid
                ((Persistence_landscape_on_grid *)
                 &distance.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      l.number_of_functions_for_projections_to_reals =
           l.number_of_functions_for_projections_to_reals + 1;
    }
    sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_1 + 7));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_c8,sVar4,
             (allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_1 + 7));
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_1 + 7));
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    while( true ) {
      pdVar1 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
      pdVar6 = (pointer)std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
      if (pdVar1 == pdVar6) break;
      sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
      local_f8 = 0.0;
      std::allocator<double>::allocator((allocator<double> *)((long)&i_2 + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_f0,sVar4,&local_f8,
                 (allocator<double> *)((long)&i_2 + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&i_2 + 7));
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_c8,
                            (size_type)
                            v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::operator=
                (pvVar7,(vector<double,_std::allocator<double>_> *)local_f0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_f0);
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1);
    }
    j = 0;
    while( true ) {
      sVar4 = std::
              vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
              ::size((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                      *)&file_no);
      if (j == sVar4) break;
      local_110 = j;
      while( true ) {
        sVar4 = std::
                vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                ::size((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                        *)&file_no);
        if (local_110 == sVar4) break;
        first = std::
                vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                ::operator[]((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                              *)&file_no,j);
        second = std::
                 vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                 ::operator[]((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                               *)&file_no,local_110);
        dVar9 = Gudhi::Persistence_representations::compute_distance_of_landscapes_on_grid
                          (first,second,
                           (double)filenames.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,local_110);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,j);
        *pvVar8 = dVar9;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,j);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,local_110);
        *pvVar8 = dVar9;
        local_110 = local_110 + 1;
      }
      j = j + 1;
    }
    std::ofstream::ofstream(&i_3);
    std::ofstream::open(&i_3,"distance.g_land",0x10);
    j_1 = 0;
    while( true ) {
      sVar4 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)local_c8);
      if (j_1 == sVar4) break;
      local_320 = 0;
      while( true ) {
        sVar4 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)local_c8);
        if (local_320 == sVar4) break;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,j_1);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,local_320);
        poVar3 = (ostream *)std::ostream::operator<<(&std::clog,*pvVar8);
        std::operator<<(poVar3," ");
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_c8,j_1);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,local_320);
        poVar3 = (ostream *)std::ostream::operator<<(&i_3,*pvVar8);
        std::operator<<(poVar3," ");
        local_320 = local_320 + 1;
      }
      std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(&i_3,std::endl<char,std::char_traits<char>>);
      j_1 = j_1 + 1;
    }
    std::ofstream::close();
    std::operator<<((ostream *)&std::clog,"Distance can be found in \'distance.g_land\' file\n");
    argv_local._4_4_ = 0;
    std::ofstream::~ofstream(&i_3);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_c8);
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::~vector((vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
               *)&file_no);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_40);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
            << "be created beforehand).\n"
            << "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
            << "maps. For L^infty distance choose p = -1. \n"
            << "The remaining parameters of this program are names of files with persistence landscapes on grid.\n";

  if (argc < 3) {
    std::clog << "Wrong number of parameters, the program will now terminate \n";
    return 1;
  }

  int pp = atoi(argv[1]);
  double p = std::numeric_limits<double>::max();
  if (pp != -1) {
    p = pp;
  }

  std::vector<const char*> filenames;
  for (int i = 2; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }
  std::vector<Persistence_landscape_on_grid> landscaspes;
  landscaspes.reserve(filenames.size());
  for (size_t file_no = 0; file_no != filenames.size(); ++file_no) {
    Persistence_landscape_on_grid l;
    l.load_landscape_from_file(filenames[file_no]);
    landscaspes.push_back(l);
  }

  // and now we will compute the scalar product of landscapes.

  // first we prepare an array:
  std::vector<std::vector<double> > distance(filenames.size());
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::vector<double> v(filenames.size(), 0);
    distance[i] = v;
  }

  // and now we can compute the scalar product:
  for (size_t i = 0; i != landscaspes.size(); ++i) {
    for (size_t j = i; j != landscaspes.size(); ++j) {
      distance[i][j] = distance[j][i] = compute_distance_of_landscapes_on_grid(landscaspes[i], landscaspes[j], p);
    }
  }

  // and now output the result to the screen and a file:
  std::ofstream out;
  out.open("distance.g_land");
  for (size_t i = 0; i != distance.size(); ++i) {
    for (size_t j = 0; j != distance.size(); ++j) {
      std::clog << distance[i][j] << " ";
      out << distance[i][j] << " ";
    }
    std::clog << std::endl;
    out << std::endl;
  }
  out.close();

  std::clog << "Distance can be found in 'distance.g_land' file\n";
  return 0;
}